

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall
t_py_generator::generate_py_struct_required_validator
          (t_py_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  e_req eVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pptVar5;
  string *psVar6;
  string local_68 [32];
  t_field *local_48;
  t_field *field;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_py_generator *this_local;
  
  poVar3 = t_generator::indent(&this->super_t_generator,out);
  poVar3 = std::operator<<(poVar3,"def validate(self):");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  sVar4 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
  if (sVar4 != 0) {
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_30);
    local_38 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_30._M_current = local_38;
    while( true ) {
      field = (t_field *)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                        ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&field);
      if (!bVar1) break;
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      local_48 = *pptVar5;
      eVar2 = t_field::get_req(local_48);
      if (eVar2 == T_REQUIRED) {
        poVar3 = t_generator::indent(&this->super_t_generator,out);
        poVar3 = std::operator<<(poVar3,"if self.");
        psVar6 = t_field::get_name_abi_cxx11_(local_48);
        poVar3 = std::operator<<(poVar3,(string *)psVar6);
        poVar3 = std::operator<<(poVar3," is None:");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        poVar3 = t_generator::indent(&this->super_t_generator,out);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])();
        poVar3 = std::operator<<(poVar3,local_68);
        poVar3 = std::operator<<(poVar3,"raise TProtocolException(message=\'Required field ");
        psVar6 = t_field::get_name_abi_cxx11_(local_48);
        poVar3 = std::operator<<(poVar3,(string *)psVar6);
        poVar3 = std::operator<<(poVar3," is unset!\')");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string(local_68);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_30);
    }
  }
  poVar3 = t_generator::indent(&this->super_t_generator,out);
  poVar3 = std::operator<<(poVar3,"return");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down(&this->super_t_generator);
  return;
}

Assistant:

void t_py_generator::generate_py_struct_required_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "def validate(self):" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();

  if (fields.size() > 0) {
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      t_field* field = (*f_iter);
      if (field->get_req() == t_field::T_REQUIRED) {
        indent(out) << "if self." << field->get_name() << " is None:" << endl;
        indent(out) << indent_str() << "raise TProtocolException(message='Required field "
                    << field->get_name() << " is unset!')" << endl;
      }
    }
  }

  indent(out) << "return" << endl;
  indent_down();
}